

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

TxOut * __thiscall
cfd::core::Psbt::GetTxInUtxo
          (TxOut *__return_storage_ptr__,Psbt *this,uint32_t index,bool ignore_error,
          bool *is_witness)

{
  void *pvVar1;
  int64_t *piVar2;
  long lVar3;
  CfdException *this_00;
  long lVar4;
  long lVar5;
  ByteData local_90;
  Amount local_78;
  Script local_68;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xa13,"GetTxInUtxo");
  pvVar1 = this->wally_psbt_pointer_;
  lVar4 = (ulong)index * 0x110;
  piVar2 = *(int64_t **)(*(long *)((long)pvVar1 + 0x10) + 8 + lVar4);
  if (piVar2 == (int64_t *)0x0) {
    lVar3 = *(long *)(*(long *)((long)pvVar1 + 0x10) + lVar4);
    if (lVar3 == 0) {
      if (ignore_error) {
        TxOut::TxOut(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      local_68._vptr_Script = (_func_int **)0x58651e;
      local_68.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xa2f;
      local_68.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = "GetTxInUtxo";
      logger::log<>((CfdSourceLocation *)&local_68,kCfdLogLevelWarning,"utxo not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_68._vptr_Script =
           (_func_int **)
           &local_68.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"psbt utxo not found error.","");
      CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&local_68);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (is_witness != (bool *)0x0) {
      *is_witness = false;
    }
    lVar5 = (ulong)*(uint *)(*(long *)(*(long *)((long)pvVar1 + 8) + 8) + 0x20 + (ulong)index * 0xd0
                            ) * 0x70;
    Amount::Amount(&local_78,*(int64_t *)(*(long *)(lVar3 + 0x20) + lVar5));
    lVar4 = *(long *)(*(long *)(*(long *)((long)pvVar1 + 0x10) + lVar4) + 0x20);
    ByteData::ByteData(&local_90,*(uint8_t **)(lVar4 + 8 + lVar5),
                       *(uint32_t *)(lVar4 + 0x10 + lVar5));
    Script::Script(&local_68,&local_90);
    TxOut::TxOut(__return_storage_ptr__,&local_78,&local_68);
  }
  else {
    if (is_witness != (bool *)0x0) {
      *is_witness = true;
    }
    Amount::Amount(&local_78,*piVar2);
    lVar4 = *(long *)(*(long *)((long)pvVar1 + 0x10) + 8 + lVar4);
    ByteData::ByteData(&local_90,*(uint8_t **)(lVar4 + 8),*(uint32_t *)(lVar4 + 0x10));
    Script::Script(&local_68,&local_90);
    TxOut::TxOut(__return_storage_ptr__,&local_78,&local_68);
  }
  Script::~Script(&local_68);
  if (local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

TxOut Psbt::GetTxInUtxo(
    uint32_t index, bool ignore_error, bool *is_witness) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (psbt_pointer->inputs[index].witness_utxo != nullptr) {
    if (is_witness != nullptr) *is_witness = true;
    return TxOut(
        Amount(static_cast<int64_t>(
            psbt_pointer->inputs[index].witness_utxo->satoshi)),
        Script(ByteData(
            psbt_pointer->inputs[index].witness_utxo->script,
            static_cast<uint32_t>(
                psbt_pointer->inputs[index].witness_utxo->script_len))));
  } else if (psbt_pointer->inputs[index].utxo != nullptr) {
    if (is_witness != nullptr) {
      *is_witness = (psbt_pointer->inputs[index].witness_utxo != nullptr);
    }
    uint32_t vout = psbt_pointer->tx->inputs[index].index;
    return TxOut(
        Amount(static_cast<int64_t>(
            psbt_pointer->inputs[index].utxo->outputs[vout].satoshi)),
        Script(ByteData(
            psbt_pointer->inputs[index].utxo->outputs[vout].script,
            static_cast<uint32_t>(
                psbt_pointer->inputs[index].utxo->outputs[vout].script_len))));
  } else if (ignore_error) {
    return TxOut();
  } else {
    warn(CFD_LOG_SOURCE, "utxo not found.");
    throw CfdException(kCfdIllegalStateError, "psbt utxo not found error.");
  }
}